

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool processSources(cmTarget *tgt,
                   vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                   *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *srcs,
                   hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                   *uniqueSrcs,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
                   bool debugSources)

{
  cmMakefile *mf;
  pointer ppTVar1;
  cmLinkImplItem *pcVar2;
  cmMakefile *this;
  bool bVar3;
  byte bVar4;
  char *pcVar5;
  cmSourceFile *this_00;
  string *psVar6;
  cmake *pcVar7;
  ostream *poVar8;
  pointer ppTVar9;
  pointer pbVar10;
  string *sourceName;
  byte local_2b9;
  allocator local_2b1;
  string usedSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entrySources;
  string local_228;
  string fullPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream err;
  
  mf = tgt->Makefile;
  ppTVar9 = (entries->
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (entries->
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = 0;
  do {
    if (ppTVar9 == ppTVar1) {
LAB_0038073e:
      return (bool)(bVar4 & 1);
    }
    pcVar2 = (*ppTVar9)->LinkImplItem;
    entrySources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    entrySources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    entrySources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
    usedSources._M_string_length = 0;
    usedSources.field_2._M_local_buf[0] = '\0';
    pcVar5 = cmCompiledGeneratorExpression::Evaluate
                       (((*ppTVar9)->ge).x_,mf,config,false,tgt,tgt,dagChecker,&usedSources);
    std::__cxx11::string::string((string *)&err,pcVar5,(allocator *)&fullPath);
    cmSystemTools::ExpandListArgument((string *)&err,&entrySources,false);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&usedSources);
    sourceName = entrySources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    if ((((*ppTVar9)->ge).x_)->HadContextSensitiveCondition != false) {
      bVar4 = 1;
    }
    while (sourceName !=
           entrySources.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = cmMakefile::GetOrCreateSource(mf,sourceName,false);
      usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
      usedSources._M_string_length = 0;
      usedSources.field_2._M_local_buf[0] = '\0';
      psVar6 = cmSourceFile::GetFullPath(this_00,&usedSources);
      std::__cxx11::string::string((string *)&fullPath,(string *)psVar6);
      if (fullPath._M_string_length == 0) {
        if (usedSources._M_string_length != 0) {
          pcVar7 = cmMakefile::GetCMakeInstance(mf);
          cmake::IssueMessage(pcVar7,FATAL_ERROR,&usedSources,&((tgt->Internal).Pointer)->Backtrace)
          ;
        }
LAB_00380533:
        bVar3 = false;
        local_2b9 = bVar4;
      }
      else {
        if (((pcVar2->super_cmLinkItem).super_string._M_string_length != 0) &&
           (bVar3 = cmsys::SystemTools::FileIsFullPath((sourceName->_M_dataplus)._M_p), !bVar3)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
          if ((pcVar2->super_cmLinkItem).super_string._M_string_length == 0) {
            poVar8 = std::operator<<((ostream *)&err,
                                     "Found relative path while evaluating sources of \"");
            poVar8 = std::operator<<(poVar8,(string *)&tgt->Name);
            poVar8 = std::operator<<(poVar8,"\":\n  \"");
            poVar8 = std::operator<<(poVar8,(string *)sourceName);
            pcVar5 = "\"\n";
          }
          else {
            poVar8 = std::operator<<((ostream *)&err,"Target \"");
            poVar8 = std::operator<<(poVar8,(string *)pcVar2);
            poVar8 = std::operator<<(poVar8,
                                     "\" contains relative path in its INTERFACE_SOURCES:\n  \"");
            poVar8 = std::operator<<(poVar8,(string *)sourceName);
            pcVar5 = "\"";
          }
          std::operator<<(poVar8,pcVar5);
          this = tgt->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(this,FATAL_ERROR,&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
          goto LAB_00380533;
        }
        bVar3 = true;
        std::__cxx11::string::_M_assign((string *)sourceName);
      }
      std::__cxx11::string::~string((string *)&fullPath);
      std::__cxx11::string::~string((string *)&usedSources);
      sourceName = sourceName + 1;
      if (!bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&entrySources);
        bVar4 = local_2b9;
        goto LAB_0038073e;
      }
    }
    usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
    usedSources._M_string_length = 0;
    usedSources.field_2._M_local_buf[0] = '\0';
    for (pbVar10 = entrySources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar10 != sourceName;
        pbVar10 = pbVar10 + 1) {
      std::__cxx11::string::string((string *)&err,(string *)pbVar10);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)&fullPath,uniqueSrcs,(value_type *)&err);
      if ((fullPath.field_2._M_local_buf[0] == '\x01') &&
         (std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(srcs,(value_type *)&err), debugSources)) {
        std::operator+(&local_228," * ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err);
        std::operator+(&fullPath,&local_228,"\n");
        std::__cxx11::string::append((string *)&usedSources);
        std::__cxx11::string::~string((string *)&fullPath);
        std::__cxx11::string::~string((string *)&local_228);
      }
      std::__cxx11::string::~string((string *)&err);
      sourceName = entrySources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (usedSources._M_string_length != 0) {
      pcVar7 = cmMakefile::GetCMakeInstance(mf);
      std::__cxx11::string::string((string *)&local_1e8,"Used sources for target ",&local_2b1);
      std::operator+(&local_1c8,&local_1e8,&tgt->Name);
      std::operator+(&local_228,&local_1c8,":\n");
      std::operator+(&fullPath,&local_228,&usedSources);
      cmListFileBacktrace::cmListFileBacktrace
                ((cmListFileBacktrace *)&err,&(((*ppTVar9)->ge).x_)->Backtrace);
      cmake::IssueMessage(pcVar7,LOG,&fullPath,(cmListFileBacktrace *)&err);
      std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)&err);
      std::__cxx11::string::~string((string *)&fullPath);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    std::__cxx11::string::~string((string *)&usedSources);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&entrySources);
    ppTVar9 = ppTVar9 + 1;
  } while( true );
}

Assistant:

static bool processSources(cmTarget const* tgt,
      const std::vector<cmTargetInternals::TargetPropertyEntry*> &entries,
      std::vector<std::string> &srcs,
      UNORDERED_SET<std::string> &uniqueSrcs,
      cmGeneratorExpressionDAGChecker *dagChecker,
      std::string const& config, bool debugSources)
{
  cmMakefile *mf = tgt->GetMakefile();

  bool contextDependent = false;

  for (std::vector<cmTargetInternals::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    std::vector<std::string> entrySources;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(mf,
                                              config,
                                              false,
                                              tgt,
                                              tgt,
                                              dagChecker),
                                    entrySources);

    if ((*it)->ge->GetHadContextSensitiveCondition())
      {
      contextDependent = true;
      }

    for(std::vector<std::string>::iterator i = entrySources.begin();
        i != entrySources.end(); ++i)
      {
      std::string& src = *i;
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string fullPath = sf->GetFullPath(&e);
      if(fullPath.empty())
        {
        if(!e.empty())
          {
          cmake* cm = mf->GetCMakeInstance();
          cm->IssueMessage(cmake::FATAL_ERROR, e,
                          tgt->GetBacktrace());
          }
        return contextDependent;
        }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src.c_str()))
        {
        std::ostringstream err;
        if (!targetName.empty())
          {
          err << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_SOURCES:\n"
            "  \"" << src << "\"";
          }
        else
          {
          err << "Found relative path while evaluating sources of "
          "\"" << tgt->GetName() << "\":\n  \"" << src << "\"\n";
          }
        tgt->GetMakefile()->IssueMessage(cmake::FATAL_ERROR, err.str());
        return contextDependent;
        }
      src = fullPath;
      }
    std::string usedSources;
    for(std::vector<std::string>::iterator
          li = entrySources.begin(); li != entrySources.end(); ++li)
      {
      std::string src = *li;

      if(uniqueSrcs.insert(src).second)
        {
        srcs.push_back(src);
        if (debugSources)
          {
          usedSources += " * " + src + "\n";
          }
        }
      }
    if (!usedSources.empty())
      {
      mf->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used sources for target ")
                            + tgt->GetName() + ":\n"
                            + usedSources, (*it)->ge->GetBacktrace());
      }
    }
  return contextDependent;
}